

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<std::unique_ptr<i1,_std::default_delete<i1>_>,_boost::ext::di::v1_3_0::scopes::wrapper<std::unique_ptr<i1,_std::default_delete<i1>_>_>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::unique_ptr<i1,std::default_delete<i1>>,__25>
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
           *this)

{
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  *in_RSI;
  wrapper<std::unique_ptr<i1,_std::default_delete<i1>_>_> in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  unique_ptr<i1,_std::default_delete<i1>_> uVar1;
  
  uVar1._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
  super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
  _M_head_impl = (__uniq_ptr_data<i1,_std::default_delete<i1>,_true,_true>)
                 (__uniq_ptr_data<i1,_std::default_delete<i1>,_true,_true>)
                 in_RDI.object._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
                 super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
                 super__Head_base<0UL,_i1_*,_false>._M_head_impl;
  binder::
  resolve<std::unique_ptr<i1,std::default_delete<i1>>,__25,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,i1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)in_RDI.object._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
                super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
                super__Head_base<0UL,_i1_*,_false>._M_head_impl);
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_25,std::unique_ptr<i1,std::default_delete<i1>>>>,int>
  ::
  create<std::unique_ptr<i1,std::default_delete<i1>>,__25,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
            (in_RSI,(provider<boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                     *)uVar1._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
                       super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
                       super__Head_base<0UL,_i1_*,_false>._M_head_impl);
  return (wrapper<std::unique_ptr<i1,_std::default_delete<i1>_>_>)
         (__uniq_ptr_data<i1,_std::default_delete<i1>,_true,_true>)
         in_RDI.object._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
         super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
         _M_head_impl;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }